

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightredis.cpp
# Opt level: O0

int main(void)

{
  int local_5f4;
  undefined1 local_5f0 [8];
  reactor react;
  sockaddr_in servaddr;
  int listenfd;
  int epollfd;
  
  servaddr.sin_zero._0_4_ = socket(2,1,0);
  if (servaddr.sin_zero._0_4_ != -1) {
    bzero((void *)((long)&react.events[99].data + 4),0x10);
    react.events[99].data.u64._4_2_ = 2;
    react.events[99].data.u64._6_2_ = htons(0x2695);
    htonl(0);
    bind(servaddr.sin_zero._0_4_,(sockaddr *)((long)&react.events[99].data + 4),0x10);
  }
  listen(servaddr.sin_zero._0_4_,0x400);
  reactor::reactor((reactor *)local_5f0,(int *)(servaddr.sin_zero + 4),servaddr.sin_zero._0_4_);
  local_5f4 = -1;
  reactor::reactor_listen((reactor *)local_5f0,&local_5f4);
  close(servaddr.sin_zero._4_4_);
  reactor::~reactor((reactor *)local_5f0);
  return 0;
}

Assistant:

int main(){
      int epollfd,listenfd;
      struct sockaddr_in servaddr;

      listenfd=socket(AF_INET,SOCK_STREAM,0);

      if(listenfd!=-1){
            bzero(&servaddr,sizeof(servaddr));
            servaddr.sin_family=AF_INET;
            servaddr.sin_port=htons(9877);
            servaddr.sin_addr.s_addr=htonl(INADDR_ANY);

            bind(listenfd,(struct sockaddr *)&servaddr,sizeof(servaddr));
      }

      listen(listenfd,1024);//backlog

      reactor react(epollfd,listenfd);
      //react.aof();
      react.reactor_listen(-1);

      close(epollfd);
}